

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O3

void __thiscall
duckdb::WindowSegmentTreeGlobalState::WindowSegmentTreeGlobalState
          (WindowSegmentTreeGlobalState *this,ClientContext *context,WindowSegmentTree *aggregator,
          idx_t group_count)

{
  vector<unsigned_long,_true> *this_00;
  iterator __position;
  pointer puVar1;
  pointer puVar2;
  pointer paVar3;
  unsigned_long uVar4;
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
  *puVar5;
  reference pvVar6;
  vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_> *pvVar7;
  type pvVar8;
  pointer paVar9;
  idx_t iVar10;
  size_type sVar11;
  size_type sVar12;
  allocator_type local_51;
  unsigned_long local_50;
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
  *local_48;
  unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
  *local_40;
  WindowAggregateStates *local_38;
  
  WindowAggregatorGlobalState::WindowAggregatorGlobalState
            (&this->super_WindowAggregatorGlobalState,context,&aggregator->super_WindowAggregator,
             group_count);
  (this->super_WindowAggregatorGlobalState).super_WindowAggregatorState._vptr_WindowAggregatorState
       = (_func_int **)&PTR__WindowSegmentTreeGlobalState_0246bbe8;
  this->tree = aggregator;
  local_38 = &this->levels_flat_native;
  WindowAggregateStates::WindowAggregateStates
            (local_38,&(this->super_WindowAggregatorGlobalState).aggr);
  this_00 = &this->levels_flat_start;
  (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_40 = &this->build_started;
  local_48 = &this->build_completed;
  (this->build_started).
  super_unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  .super__Head_base<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_false>._M_head_impl =
       (vector<std::atomic<unsigned_long>,_true> *)0x0;
  (this->build_completed).
  super_unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  .super__Head_base<0UL,_duckdb::vector<std::atomic<unsigned_long>,_true>_*,_false>._M_head_impl =
       (vector<std::atomic<unsigned_long>,_true> *)0x0;
  (this->tree_allocators).
  super_vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tree_allocators).
  super_vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tree_allocators).
  super_vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 0;
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(iterator)0x0,
             &local_50);
  local_50 = 0;
  sVar11 = 0xffffffffffffffff;
  while( true ) {
    uVar4 = local_50;
    sVar12 = sVar11 + 1;
    iVar10 = group_count;
    if (sVar12 != 0) {
      pvVar6 = vector<unsigned_long,_true>::operator[](this_00,sVar11);
      iVar10 = uVar4 - *pvVar6;
    }
    if (iVar10 < 2) break;
    local_50 = local_50 + (iVar10 - 1 >> 4) + 1;
    __position._M_current =
         (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    sVar11 = sVar12;
    if (__position._M_current ==
        (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,__position,&local_50
                );
    }
    else {
      *__position._M_current = local_50;
      (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  if (local_50 == 0) {
    local_50 = 1;
  }
  WindowAggregateStates::Initialize(local_38,local_50);
  LOCK();
  (this->build_level).super___atomic_base<unsigned_long>._M_i = 0;
  UNLOCK();
  puVar1 = (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar7 = (vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_> *)
           operator_new(0x18);
  ::std::vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>::vector
            (pvVar7,(long)puVar2 - (long)puVar1 >> 3,&local_51);
  puVar5 = local_40;
  ::std::
  __uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ::reset((__uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
           *)local_40,(pointer)pvVar7);
  pvVar8 = unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
           ::operator*(puVar5);
  paVar3 = (pvVar8->
           super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>).
           super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar9 = (pvVar8->
                super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ).
                super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar9 != paVar3; paVar9 = paVar9 + 1) {
    LOCK();
    (paVar9->super___atomic_base<unsigned_long>)._M_i = 0;
    UNLOCK();
  }
  puVar1 = (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->levels_flat_start).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pvVar7 = (vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_> *)
           operator_new(0x18);
  ::std::vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>::vector
            (pvVar7,(long)puVar2 - (long)puVar1 >> 3,&local_51);
  puVar5 = local_48;
  ::std::
  __uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
  ::reset((__uniq_ptr_impl<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>_>
           *)local_48,(pointer)pvVar7);
  pvVar8 = unique_ptr<duckdb::vector<std::atomic<unsigned_long>,_true>,_std::default_delete<duckdb::vector<std::atomic<unsigned_long>,_true>_>,_true>
           ::operator*(puVar5);
  paVar3 = (pvVar8->
           super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>).
           super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (paVar9 = (pvVar8->
                super_vector<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ).
                super__Vector_base<std::atomic<unsigned_long>,_std::allocator<std::atomic<unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; paVar9 != paVar3; paVar9 = paVar9 + 1) {
    LOCK();
    (paVar9->super___atomic_base<unsigned_long>)._M_i = 0;
    UNLOCK();
  }
  return;
}

Assistant:

WindowSegmentTreeGlobalState::WindowSegmentTreeGlobalState(ClientContext &context, const WindowSegmentTree &aggregator,
                                                           idx_t group_count)
    : WindowAggregatorGlobalState(context, aggregator, group_count), tree(aggregator), levels_flat_native(aggr) {

	D_ASSERT(!aggregator.wexpr.children.empty());

	// compute space required to store internal nodes of segment tree
	levels_flat_start.push_back(0);

	idx_t levels_flat_offset = 0;
	idx_t level_current = 0;
	// level 0 is data itself
	idx_t level_size;
	// iterate over the levels of the segment tree
	while ((level_size =
	            (level_current == 0 ? group_count : levels_flat_offset - levels_flat_start[level_current - 1])) > 1) {
		for (idx_t pos = 0; pos < level_size; pos += TREE_FANOUT) {
			levels_flat_offset++;
		}

		levels_flat_start.push_back(levels_flat_offset);
		level_current++;
	}

	// Corner case: single element in the window
	if (levels_flat_offset == 0) {
		++levels_flat_offset;
	}

	levels_flat_native.Initialize(levels_flat_offset);

	// Start by building from the bottom level
	build_level = 0;

	build_started = make_uniq<AtomicCounters>(levels_flat_start.size());
	for (auto &counter : *build_started) {
		counter = 0;
	}

	build_completed = make_uniq<AtomicCounters>(levels_flat_start.size());
	for (auto &counter : *build_completed) {
		counter = 0;
	}
}